

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall Jinx::Impl::BinaryWriter::Write(BinaryWriter *this,void *val,size_t bytes)

{
  element_type *this_00;
  size_t bytes_local;
  void *val_local;
  BinaryWriter *this_local;
  
  this_00 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  Buffer::Write(this_00,&this->m_pos,val,bytes);
  return;
}

Assistant:

void Write(const void * val, size_t bytes) { m_buffer->Write(&m_pos, val, bytes); }